

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostics.cpp
# Opt level: O0

bool hasValidLinks(Network *nw)

{
  bool bVar1;
  reference ppLVar2;
  ENerror *e;
  Link *link;
  iterator __end1;
  iterator __begin1;
  vector<Link_*,_std::allocator<Link_*>_> *__range1;
  bool result;
  Network *nw_local;
  
  __end1 = std::vector<Link_*,_std::allocator<Link_*>_>::begin(&nw->links);
  link = (Link *)std::vector<Link_*,_std::allocator<Link_*>_>::end(&nw->links);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>
                                *)&link);
    if (!bVar1) break;
    ppLVar2 = __gnu_cxx::__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::
              operator*(&__end1);
    (*((*ppLVar2)->super_Element)._vptr_Element[6])(*ppLVar2,nw);
    __gnu_cxx::__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::operator++
              (&__end1);
  }
  return true;
}

Assistant:

bool hasValidLinks(Network* nw)
{
    bool result = true;
    for (Link* link : nw->links)
    {
        try
        {
            link->validate(nw);
        }
        catch (ENerror const& e)
        {
            nw->msgLog << e.msg;
            result = false;
        }
    }
    return result;
}